

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_accept(quicly_conn_t **conn,quicly_context_t *ctx,sockaddr *dest_addr,sockaddr *src_addr,
                 quicly_decoded_packet_t *packet,quicly_address_token_plaintext_t *address_token,
                 quicly_cid_plaintext_t *new_cid,ptls_handshake_properties_t *handshake_properties)

{
  quicly_conn_t *pqVar1;
  st_quicly_handshake_space_t *psVar2;
  size_t len;
  uint8_t *_src;
  ptls_t *tls;
  long lVar3;
  ptls_iovec_t src;
  ptls_iovec_t cid;
  ptls_iovec_t salt_00;
  int iVar4;
  st_ptls_salt_t *p;
  ptls_cipher_suite_t *server_name;
  quicly_conn_t *pqVar5;
  char *pcVar6;
  uint8_t *in_stack_fffffffffffffe78;
  quicly_context_t *in_stack_fffffffffffffe80;
  quicly_conn_t *in_stack_fffffffffffffe88;
  uint64_t *in_stack_fffffffffffffe90;
  quicly_decoded_packet_t *in_stack_fffffffffffffe98;
  uint64_t *in_stack_fffffffffffffea0;
  void *in_stack_fffffffffffffea8;
  st_quicly_cipher_context_t *in_stack_fffffffffffffeb0;
  ptls_cipher_context_t *in_stack_fffffffffffffeb8;
  ptls_cipher_suite_t *in_stack_fffffffffffffec0;
  uint8_t *in_stack_fffffffffffffec8;
  ptls_iovec_t *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  quicly_conn_t *in_stack_fffffffffffffef0;
  ptls_iovec_t *remote_cid;
  uint32_t protocol_version;
  quicly_context_t *ctx_00;
  quicly_conn_t *_conn_1;
  ptls_handshake_properties_t *in_stack_ffffffffffffff48;
  size_t _l;
  quicly_conn_t *_conn;
  int local_98;
  int ret;
  int is_ack_only;
  uint64_t offending_frame_type;
  uint64_t pn;
  uint64_t next_expected_pn;
  ptls_iovec_t payload;
  anon_struct_40_3_1d7380ec cipher;
  st_ptls_salt_t *salt;
  quicly_address_token_plaintext_t *address_token_local;
  quicly_decoded_packet_t *packet_local;
  sockaddr *src_addr_local;
  sockaddr *dest_addr_local;
  quicly_context_t *ctx_local;
  quicly_conn_t **conn_local;
  
  pcVar6 = &stack0xfffffffffffffe78;
  memset(&payload.len,0,0x28);
  *conn = (quicly_conn_t *)0x0;
  if ((*(packet->octets).base & 0xf0) == 0xc0) {
    p = get_salt(packet->version);
    if (p == (st_ptls_salt_t *)0x0) {
      local_98 = 0xff01;
      pcVar6 = &stack0xfffffffffffffe78;
    }
    else if (packet->datagram_size < 0x4b0) {
      local_98 = 0xff01;
      pcVar6 = &stack0xfffffffffffffe78;
    }
    else if ((packet->cid).dest.encrypted.len < 8) {
      local_98 = 0x2000a;
      pcVar6 = &stack0xfffffffffffffe78;
    }
    else {
      server_name = get_aes128gcmsha256(in_stack_fffffffffffffe80);
      protocol_version = (uint32_t)((ulong)&payload.len >> 0x20);
      ctx_00 = (quicly_context_t *)packet;
      ptls_iovec_init(p,0x14);
      cid.len = (size_t)in_stack_fffffffffffffed0;
      cid.base = in_stack_fffffffffffffec8;
      salt_00.len._0_4_ = in_stack_fffffffffffffee8;
      salt_00.base = (uint8_t *)in_stack_fffffffffffffee0;
      salt_00.len._4_4_ = in_stack_fffffffffffffeec;
      local_98 = setup_initial_encryption
                           (in_stack_fffffffffffffec0,
                            (st_quicly_cipher_context_t *)in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb0,cid,
                            (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),salt_00,
                            in_stack_fffffffffffffef0);
      if (local_98 == 0) {
        cipher.egress.header_protection._0_4_ = 1;
        iVar4 = decrypt_packet(in_stack_fffffffffffffeb8,
                               (_func_int_void_ptr_uint64_t_quicly_decoded_packet_t_ptr_size_t_size_t_ptr
                                *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                               in_stack_fffffffffffffe90,in_stack_fffffffffffffed0);
        if (iVar4 == 0) {
          remote_cid = &(packet->cid).src;
          quicly_cc_calc_initial_cwnd
                    (ctx->initcwnd_packets,(uint16_t)(ctx->transport_params).max_udp_payload_size);
          pqVar5 = create_connection(ctx_00,protocol_version,(char *)server_name,
                                     (sockaddr *)handshake_properties,(sockaddr *)new_cid,remote_cid
                                     ,(quicly_cid_plaintext_t *)_conn_1,in_stack_ffffffffffffff48,
                                     (uint32_t)_l);
          *conn = pqVar5;
          if (pqVar5 == (quicly_conn_t *)0x0) {
            local_98 = 0x201;
            pcVar6 = &stack0xfffffffffffffe78;
          }
          else {
            ((*conn)->super).state = QUICLY_STATE_ACCEPTING;
            src.len = (size_t)in_stack_fffffffffffffe80;
            src.base = in_stack_fffffffffffffe78;
            quicly_set_cid((quicly_cid_t *)0x13f32f,src);
            if ((address_token != (quicly_address_token_plaintext_t *)0x0) &&
               (*(byte *)&((*conn)->super).remote.address_validation =
                     *(byte *)&((*conn)->super).remote.address_validation & 0xfe | 1,
               address_token->type == QUICLY_ADDRESS_TOKEN_TYPE_RETRY)) {
              pqVar5 = *conn;
              pqVar1 = *conn;
              *(undefined8 *)(pqVar5->retry_scid).cid =
                   *(undefined8 *)(pqVar1->super).original_dcid.cid;
              *(undefined8 *)((pqVar5->retry_scid).cid + 8) =
                   *(undefined8 *)((pqVar1->super).original_dcid.cid + 8);
              *(undefined4 *)((pqVar5->retry_scid).cid + 0x10) =
                   *(undefined4 *)((pqVar1->super).original_dcid.cid + 0x10);
              (pqVar5->retry_scid).len = (pqVar1->super).original_dcid.len;
              pqVar5 = *conn;
              *(undefined8 *)(pqVar5->super).original_dcid.cid =
                   *(undefined8 *)&address_token->field_4;
              *(undefined8 *)((pqVar5->super).original_dcid.cid + 8) =
                   *(undefined8 *)((long)&address_token->field_4 + 8);
              *(undefined4 *)((pqVar5->super).original_dcid.cid + 0x10) =
                   *(undefined4 *)((long)&address_token->field_4 + 0x10);
              (pqVar5->super).original_dcid.len = (address_token->field_4).retry.original_dcid.len;
            }
            local_98 = setup_handshake_space_and_flow
                                 (in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
            pcVar6 = &stack0xfffffffffffffe78;
            if (local_98 == 0) {
              ((*conn)->initial->super).next_expected_packet_number = 0;
              psVar2 = (*conn)->initial;
              (psVar2->cipher).ingress.aead = (ptls_aead_context_t *)payload.len;
              (psVar2->cipher).ingress.header_protection =
                   (ptls_cipher_context_t *)cipher.ingress.aead;
              psVar2 = (*conn)->initial;
              (psVar2->cipher).egress.aead = (ptls_aead_context_t *)cipher.ingress.header_protection
              ;
              (psVar2->cipher).egress.header_protection =
                   (ptls_cipher_context_t *)cipher.egress.aead;
              cipher.egress.header_protection._0_4_ = 0;
              ((*conn)->crypto).handshake_properties.collected_extensions =
                   server_collected_extensions;
              (*conn)->initial->largest_ingress_udp_payload_size = (uint16_t)packet->datagram_size;
              pcVar6 = &stack0xfffffffffffffe78;
              if ((quicly_trace_fp != (FILE *)0x0) &&
                 (iVar4 = ptls_skip_tracing(((*conn)->crypto).tls),
                 pcVar6 = &stack0xfffffffffffffe78, iVar4 == 0)) {
                len = (packet->cid).dest.encrypted.len;
                lVar3 = -(len * 2 + 0x10 & 0xfffffffffffffff0);
                pcVar6 = &stack0xfffffffffffffe78 + lVar3;
                _src = (packet->cid).dest.encrypted.base;
                *(undefined8 *)(&stack0xfffffffffffffe70 + lVar3) = 0x13f52a;
                ptls_hexdump(pcVar6,_src,len);
                *(undefined8 *)(&stack0xfffffffffffffe70 + lVar3) = 0x13f54f;
                QUICLY_ACCEPT(*(st_quicly_conn_t **)(&stack0xfffffffffffffea0 + lVar3),
                              *(int64_t *)(&stack0xfffffffffffffe98 + lVar3),
                              *(char **)(&stack0xfffffffffffffe90 + lVar3),
                              *(st_quicly_address_token_plaintext_t **)
                               (&stack0xfffffffffffffe88 + lVar3));
              }
              if (quicly_trace_fp != (FILE *)0x0) {
                tls = ((*conn)->crypto).tls;
                pcVar6[-8] = -0x69;
                pcVar6[-7] = -0xb;
                pcVar6[-6] = '\x13';
                pcVar6[-5] = '\0';
                pcVar6[-4] = '\0';
                pcVar6[-3] = '\0';
                pcVar6[-2] = '\0';
                pcVar6[-1] = '\0';
                iVar4 = ptls_skip_tracing(tls);
                if (iVar4 == 0) {
                  pcVar6[-8] = -0x11;
                  pcVar6[-7] = -0xb;
                  pcVar6[-6] = '\x13';
                  pcVar6[-5] = '\0';
                  pcVar6[-4] = '\0';
                  pcVar6[-3] = '\0';
                  pcVar6[-2] = '\0';
                  pcVar6[-1] = '\0';
                  get_epoch(pcVar6[-2]);
                  pcVar6[-8] = '\x1b';
                  pcVar6[-7] = -10;
                  pcVar6[-6] = '\x13';
                  pcVar6[-5] = '\0';
                  pcVar6[-4] = '\0';
                  pcVar6[-3] = '\0';
                  pcVar6[-2] = '\0';
                  pcVar6[-1] = '\0';
                  QUICLY_PACKET_RECEIVED
                            (*(st_quicly_conn_t **)(pcVar6 + 0x48),*(int64_t *)(pcVar6 + 0x40),
                             *(uint64_t *)(pcVar6 + 0x38),*(void **)(pcVar6 + 0x30),
                             *(size_t *)(pcVar6 + 0x28),pcVar6[0x27]);
                }
              }
              pcVar6[-8] = 'n';
              pcVar6[-7] = -10;
              pcVar6[-6] = '\x13';
              pcVar6[-5] = '\0';
              pcVar6[-4] = '\0';
              pcVar6[-3] = '\0';
              pcVar6[-2] = '\0';
              pcVar6[-1] = '\0';
              get_epoch(pcVar6[-2]);
              pcVar6[-8] = -0x66;
              pcVar6[-7] = -10;
              pcVar6[-6] = '\x13';
              pcVar6[-5] = '\0';
              pcVar6[-4] = '\0';
              pcVar6[-3] = '\0';
              pcVar6[-2] = '\0';
              pcVar6[-1] = '\0';
              QUICLY_TRACER_PACKET_RECEIVED
                        (*(st_quicly_conn_t **)(pcVar6 + 0x28),*(int64_t *)(pcVar6 + 0x20),
                         *(uint64_t *)(pcVar6 + 0x18),*(void **)(pcVar6 + 0x10),
                         *(size_t *)(pcVar6 + 8),pcVar6[7]);
              ((*conn)->super).stats.num_packets.received =
                   ((*conn)->super).stats.num_packets.received + 1;
              ((*conn)->super).stats.num_bytes.received =
                   packet->datagram_size + ((*conn)->super).stats.num_bytes.received;
              pcVar6[-8] = -10;
              pcVar6[-7] = -10;
              pcVar6[-6] = '\x13';
              pcVar6[-5] = '\0';
              pcVar6[-4] = '\0';
              pcVar6[-3] = '\0';
              pcVar6[-2] = '\0';
              pcVar6[-1] = '\0';
              local_98 = handle_payload(*(quicly_conn_t **)(pcVar6 + 0x68),
                                        *(size_t *)(pcVar6 + 0x60),*(uint8_t **)(pcVar6 + 0x58),
                                        *(size_t *)(pcVar6 + 0x50),*(uint64_t **)(pcVar6 + 0x48),
                                        *(int **)(pcVar6 + 0x40));
              if (local_98 == 0) {
                pcVar6[-8] = '?';
                pcVar6[-7] = -9;
                pcVar6[-6] = '\x13';
                pcVar6[-5] = '\0';
                pcVar6[-4] = '\0';
                pcVar6[-3] = '\0';
                pcVar6[-2] = '\0';
                pcVar6[-1] = '\0';
                local_98 = record_receipt(*(st_quicly_pn_space_t **)(pcVar6 + 0x28),
                                          *(uint64_t *)(pcVar6 + 0x20),*(int *)(pcVar6 + 0x1c),
                                          *(int64_t *)(pcVar6 + 0x10),*(int64_t **)(pcVar6 + 8));
              }
            }
          }
        }
        else {
          local_98 = 0xff09;
          pcVar6 = &stack0xfffffffffffffe78;
        }
      }
    }
  }
  else {
    local_98 = 0xff01;
    pcVar6 = &stack0xfffffffffffffe78;
  }
  if (*conn != (quicly_conn_t *)0x0) {
    if (local_98 == 0) {
      ((*conn)->super).state = QUICLY_STATE_CONNECTED;
    }
    else {
      *(undefined8 *)(pcVar6 + -8) = 0x13f791;
      initiate_close(*(quicly_conn_t **)(pcVar6 + 0x20),*(int *)(pcVar6 + 0x1c),
                     *(uint64_t *)(pcVar6 + 0x10),*(char **)(pcVar6 + 8));
      local_98 = 0;
    }
    *(undefined8 *)(pcVar6 + -8) = 0x13f7a7;
    unlock_now(*(quicly_conn_t **)(pcVar6 + -8));
  }
  if ((int)cipher.egress.header_protection != 0) {
    *(undefined8 *)(pcVar6 + -8) = 0x13f7b6;
    dispose_cipher(*(st_quicly_cipher_context_t **)(pcVar6 + -8));
    *(undefined8 *)(pcVar6 + -8) = 0x13f7c3;
    dispose_cipher(*(st_quicly_cipher_context_t **)(pcVar6 + -8));
  }
  return local_98;
}

Assistant:

int quicly_accept(quicly_conn_t **conn, quicly_context_t *ctx, struct sockaddr *dest_addr, struct sockaddr *src_addr,
                  quicly_decoded_packet_t *packet, quicly_address_token_plaintext_t *address_token,
                  const quicly_cid_plaintext_t *new_cid, ptls_handshake_properties_t *handshake_properties)
{
    const struct st_ptls_salt_t *salt;
    struct {
        struct st_quicly_cipher_context_t ingress, egress;
        int alive;
    } cipher = {};
    ptls_iovec_t payload;
    uint64_t next_expected_pn, pn, offending_frame_type = QUICLY_FRAME_TYPE_PADDING;
    int is_ack_only, ret;

    *conn = NULL;

    /* process initials only */
    if ((packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) != QUICLY_PACKET_TYPE_INITIAL) {
        ret = QUICLY_ERROR_PACKET_IGNORED;
        goto Exit;
    }
    if ((salt = get_salt(packet->version)) == NULL) {
        ret = QUICLY_ERROR_PACKET_IGNORED;
        goto Exit;
    }
    if (packet->datagram_size < QUICLY_MIN_CLIENT_INITIAL_SIZE) {
        ret = QUICLY_ERROR_PACKET_IGNORED;
        goto Exit;
    }
    if (packet->cid.dest.encrypted.len < 8) {
        ret = QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
        goto Exit;
    }
    if ((ret = setup_initial_encryption(get_aes128gcmsha256(ctx), &cipher.ingress, &cipher.egress, packet->cid.dest.encrypted, 0,
                                        ptls_iovec_init(salt->initial, sizeof(salt->initial)), NULL)) != 0)
        goto Exit;
    cipher.alive = 1;
    next_expected_pn = 0; /* is this correct? do we need to take care of underflow? */
    if ((ret = decrypt_packet(cipher.ingress.header_protection, aead_decrypt_fixed_key, cipher.ingress.aead, &next_expected_pn,
                              packet, &pn, &payload)) != 0) {
        ret = QUICLY_ERROR_DECRYPTION_FAILED;
        goto Exit;
    }

    /* create connection */
    if ((*conn = create_connection(
             ctx, packet->version, NULL, src_addr, dest_addr, &packet->cid.src, new_cid, handshake_properties,
             quicly_cc_calc_initial_cwnd(ctx->initcwnd_packets, ctx->transport_params.max_udp_payload_size))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    (*conn)->super.state = QUICLY_STATE_ACCEPTING;
    quicly_set_cid(&(*conn)->super.original_dcid, packet->cid.dest.encrypted);
    if (address_token != NULL) {
        (*conn)->super.remote.address_validation.validated = 1;
        if (address_token->type == QUICLY_ADDRESS_TOKEN_TYPE_RETRY) {
            (*conn)->retry_scid = (*conn)->super.original_dcid;
            (*conn)->super.original_dcid = address_token->retry.original_dcid;
        }
    }
    if ((ret = setup_handshake_space_and_flow(*conn, QUICLY_EPOCH_INITIAL)) != 0)
        goto Exit;
    (*conn)->initial->super.next_expected_packet_number = next_expected_pn;
    (*conn)->initial->cipher.ingress = cipher.ingress;
    (*conn)->initial->cipher.egress = cipher.egress;
    cipher.alive = 0;
    (*conn)->crypto.handshake_properties.collected_extensions = server_collected_extensions;
    (*conn)->initial->largest_ingress_udp_payload_size = packet->datagram_size;

    QUICLY_PROBE(ACCEPT, *conn, (*conn)->stash.now,
                 QUICLY_PROBE_HEXDUMP(packet->cid.dest.encrypted.base, packet->cid.dest.encrypted.len), address_token);
    QUICLY_PROBE(PACKET_RECEIVED, *conn, (*conn)->stash.now, pn, payload.base, payload.len, get_epoch(packet->octets.base[0]));

    /* handle the input; we ignore is_ack_only, we consult if there's any output from TLS in response to CH anyways */
    (*conn)->super.stats.num_packets.received += 1;
    (*conn)->super.stats.num_bytes.received += packet->datagram_size;
    if ((ret = handle_payload(*conn, QUICLY_EPOCH_INITIAL, payload.base, payload.len, &offending_frame_type, &is_ack_only)) != 0)
        goto Exit;
    if ((ret = record_receipt(&(*conn)->initial->super, pn, 0, (*conn)->stash.now, &(*conn)->egress.send_ack_at)) != 0)
        goto Exit;

Exit:
    if (*conn != NULL) {
        if (ret == 0) {
            (*conn)->super.state = QUICLY_STATE_CONNECTED;
        } else {
            initiate_close(*conn, ret, offending_frame_type, "");
            ret = 0;
        }
        unlock_now(*conn);
    }
    if (cipher.alive) {
        dispose_cipher(&cipher.ingress);
        dispose_cipher(&cipher.egress);
    }
    return ret;
}